

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

void stats_print_helper(emitter_t *emitter,_Bool merged,_Bool destroyed,_Bool unmerged,_Bool bins,
                       _Bool large,_Bool mutex,_Bool extents,_Bool hpa)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  char *pcVar18;
  char *pcVar19;
  char *pcVar20;
  char *pcVar21;
  char *pcVar22;
  char *pcVar23;
  char *pcVar24;
  long *in_FS_OFFSET;
  size_t local_470;
  uint local_468 [2];
  char *in_stack_fffffffffffffba8;
  emitter_col_t *in_stack_fffffffffffffbb0;
  char *pcVar25;
  undefined7 in_stack_fffffffffffffbb8;
  undefined1 in_stack_fffffffffffffbbf;
  char arena_ind_str [20];
  uint ninitialized;
  uint i_1;
  _Bool destroyed_initialized;
  unsigned_long __vla_expr0;
  undefined8 local_418;
  size_t sz_14;
  size_t miblen_1;
  size_t mib_1 [3];
  size_t sz_15;
  uint narenas;
  int i;
  size_t miblen_new;
  size_t stats_mutexes_mib [7];
  emitter_col_t *col_uint64_t;
  size_t sz_13;
  size_t miblen;
  size_t mib [7];
  uint64_t uptime;
  emitter_col_t col32 [1];
  emitter_col_t col64 [11];
  emitter_col_t name;
  emitter_row_t row;
  size_t sz_12;
  size_t sz_11;
  size_t sz_10;
  size_t sz_9;
  size_t sz_8;
  size_t sz_7;
  size_t sz_6;
  size_t sz_5;
  size_t sz_4;
  size_t sz_3;
  size_t sz_2;
  size_t sz_1;
  size_t sz;
  uint64_t background_thread_run_interval;
  uint64_t background_thread_num_runs;
  size_t zero_reallocs;
  size_t num_background_threads;
  size_t retained;
  size_t mapped;
  size_t resident;
  size_t metadata_thp;
  size_t metadata_rtree;
  size_t metadata_edata;
  size_t metadata;
  size_t active;
  size_t allocated;
  _Bool hpa_local;
  _Bool extents_local;
  _Bool mutex_local;
  _Bool large_local;
  _Bool bins_local;
  _Bool unmerged_local;
  _Bool destroyed_local;
  _Bool merged_local;
  emitter_t *emitter_local;
  tsd_t *tsd;
  
  iVar2 = duckdb_je_mallctl((char *)CONCAT44(ninitialized,arena_ind_str._16_4_),
                            (void *)CONCAT44(arena_ind_str._12_4_,arena_ind_str._8_4_),
                            (size_t *)arena_ind_str._0_8_,
                            (void *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                            (size_t)in_stack_fffffffffffffbb0);
  if (iVar2 != 0) {
    duckdb_je_malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n","stats.allocated");
    abort();
  }
  iVar2 = duckdb_je_mallctl((char *)CONCAT44(ninitialized,arena_ind_str._16_4_),
                            (void *)CONCAT44(arena_ind_str._12_4_,arena_ind_str._8_4_),
                            (size_t *)arena_ind_str._0_8_,
                            (void *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                            (size_t)in_stack_fffffffffffffbb0);
  if (iVar2 != 0) {
    duckdb_je_malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n","stats.active");
    abort();
  }
  iVar2 = duckdb_je_mallctl((char *)CONCAT44(ninitialized,arena_ind_str._16_4_),
                            (void *)CONCAT44(arena_ind_str._12_4_,arena_ind_str._8_4_),
                            (size_t *)arena_ind_str._0_8_,
                            (void *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                            (size_t)in_stack_fffffffffffffbb0);
  if (iVar2 != 0) {
    duckdb_je_malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n","stats.metadata");
    abort();
  }
  iVar2 = duckdb_je_mallctl((char *)CONCAT44(ninitialized,arena_ind_str._16_4_),
                            (void *)CONCAT44(arena_ind_str._12_4_,arena_ind_str._8_4_),
                            (size_t *)arena_ind_str._0_8_,
                            (void *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                            (size_t)in_stack_fffffffffffffbb0);
  if (iVar2 != 0) {
    duckdb_je_malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n","stats.metadata_edata")
    ;
    abort();
  }
  iVar2 = duckdb_je_mallctl((char *)CONCAT44(ninitialized,arena_ind_str._16_4_),
                            (void *)CONCAT44(arena_ind_str._12_4_,arena_ind_str._8_4_),
                            (size_t *)arena_ind_str._0_8_,
                            (void *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                            (size_t)in_stack_fffffffffffffbb0);
  if (iVar2 != 0) {
    duckdb_je_malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n","stats.metadata_rtree")
    ;
    abort();
  }
  iVar2 = duckdb_je_mallctl((char *)CONCAT44(ninitialized,arena_ind_str._16_4_),
                            (void *)CONCAT44(arena_ind_str._12_4_,arena_ind_str._8_4_),
                            (size_t *)arena_ind_str._0_8_,
                            (void *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                            (size_t)in_stack_fffffffffffffbb0);
  if (iVar2 != 0) {
    duckdb_je_malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n","stats.metadata_thp");
    abort();
  }
  iVar2 = duckdb_je_mallctl((char *)CONCAT44(ninitialized,arena_ind_str._16_4_),
                            (void *)CONCAT44(arena_ind_str._12_4_,arena_ind_str._8_4_),
                            (size_t *)arena_ind_str._0_8_,
                            (void *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                            (size_t)in_stack_fffffffffffffbb0);
  if (iVar2 != 0) {
    duckdb_je_malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n","stats.resident");
    abort();
  }
  iVar2 = duckdb_je_mallctl((char *)CONCAT44(ninitialized,arena_ind_str._16_4_),
                            (void *)CONCAT44(arena_ind_str._12_4_,arena_ind_str._8_4_),
                            (size_t *)arena_ind_str._0_8_,
                            (void *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                            (size_t)in_stack_fffffffffffffbb0);
  if (iVar2 == 0) {
    iVar2 = duckdb_je_mallctl((char *)CONCAT44(ninitialized,arena_ind_str._16_4_),
                              (void *)CONCAT44(arena_ind_str._12_4_,arena_ind_str._8_4_),
                              (size_t *)arena_ind_str._0_8_,
                              (void *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                              (size_t)in_stack_fffffffffffffbb0);
    if (iVar2 != 0) {
      duckdb_je_malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n","stats.retained");
      abort();
    }
    iVar2 = duckdb_je_mallctl((char *)CONCAT44(ninitialized,arena_ind_str._16_4_),
                              (void *)CONCAT44(arena_ind_str._12_4_,arena_ind_str._8_4_),
                              (size_t *)arena_ind_str._0_8_,
                              (void *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                              (size_t)in_stack_fffffffffffffbb0);
    if (iVar2 != 0) {
      duckdb_je_malloc_printf
                ("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n","stats.zero_reallocs");
      abort();
    }
    iVar2 = duckdb_je_mallctl((char *)CONCAT44(ninitialized,arena_ind_str._16_4_),
                              (void *)CONCAT44(arena_ind_str._12_4_,arena_ind_str._8_4_),
                              (size_t *)arena_ind_str._0_8_,
                              (void *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                              (size_t)in_stack_fffffffffffffbb0);
    if (iVar2 != 0) {
      duckdb_je_malloc_printf
                ("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n",
                 "stats.background_thread.num_threads");
      abort();
    }
    iVar2 = duckdb_je_mallctl((char *)CONCAT44(ninitialized,arena_ind_str._16_4_),
                              (void *)CONCAT44(arena_ind_str._12_4_,arena_ind_str._8_4_),
                              (size_t *)arena_ind_str._0_8_,
                              (void *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                              (size_t)in_stack_fffffffffffffbb0);
    if (iVar2 != 0) {
      duckdb_je_malloc_printf
                ("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n","stats.background_thread.num_runs"
                );
      abort();
    }
    iVar2 = duckdb_je_mallctl((char *)CONCAT44(ninitialized,arena_ind_str._16_4_),
                              (void *)CONCAT44(arena_ind_str._12_4_,arena_ind_str._8_4_),
                              (size_t *)arena_ind_str._0_8_,
                              (void *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                              (size_t)in_stack_fffffffffffffbb0);
    if (iVar2 != 0) {
      duckdb_je_malloc_printf
                ("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n",
                 "stats.background_thread.run_interval");
      abort();
    }
    emitter_json_object_kv_begin((emitter_t *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    emitter_json_kv((emitter_t *)arena_ind_str._0_8_,
                    (char *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                    (emitter_type_t)((ulong)in_stack_fffffffffffffbb0 >> 0x20),
                    in_stack_fffffffffffffba8);
    emitter_json_kv((emitter_t *)arena_ind_str._0_8_,
                    (char *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                    (emitter_type_t)((ulong)in_stack_fffffffffffffbb0 >> 0x20),
                    in_stack_fffffffffffffba8);
    emitter_json_kv((emitter_t *)arena_ind_str._0_8_,
                    (char *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                    (emitter_type_t)((ulong)in_stack_fffffffffffffbb0 >> 0x20),
                    in_stack_fffffffffffffba8);
    emitter_json_kv((emitter_t *)arena_ind_str._0_8_,
                    (char *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                    (emitter_type_t)((ulong)in_stack_fffffffffffffbb0 >> 0x20),
                    in_stack_fffffffffffffba8);
    emitter_json_kv((emitter_t *)arena_ind_str._0_8_,
                    (char *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                    (emitter_type_t)((ulong)in_stack_fffffffffffffbb0 >> 0x20),
                    in_stack_fffffffffffffba8);
    emitter_json_kv((emitter_t *)arena_ind_str._0_8_,
                    (char *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                    (emitter_type_t)((ulong)in_stack_fffffffffffffbb0 >> 0x20),
                    in_stack_fffffffffffffba8);
    emitter_json_kv((emitter_t *)arena_ind_str._0_8_,
                    (char *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                    (emitter_type_t)((ulong)in_stack_fffffffffffffbb0 >> 0x20),
                    in_stack_fffffffffffffba8);
    emitter_json_kv((emitter_t *)arena_ind_str._0_8_,
                    (char *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                    (emitter_type_t)((ulong)in_stack_fffffffffffffbb0 >> 0x20),
                    in_stack_fffffffffffffba8);
    emitter_json_kv((emitter_t *)arena_ind_str._0_8_,
                    (char *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                    (emitter_type_t)((ulong)in_stack_fffffffffffffbb0 >> 0x20),
                    in_stack_fffffffffffffba8);
    emitter_json_kv((emitter_t *)arena_ind_str._0_8_,
                    (char *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                    (emitter_type_t)((ulong)in_stack_fffffffffffffbb0 >> 0x20),
                    in_stack_fffffffffffffba8);
    local_470 = retained;
    emitter_table_printf
              (emitter,
               "Allocated: %zu, active: %zu, metadata: %zu (n_thp %zu, edata %zu, rtree %zu), resident: %zu, mapped: %zu, retained: %zu\n"
               ,active,metadata,metadata_edata,resident);
    emitter_table_printf
              (emitter,"Count of realloc(non-null-ptr, 0) calls: %zu\n",background_thread_num_runs);
    emitter_json_object_kv_begin((emitter_t *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    emitter_json_kv((emitter_t *)arena_ind_str._0_8_,
                    (char *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                    (emitter_type_t)((ulong)in_stack_fffffffffffffbb0 >> 0x20),
                    in_stack_fffffffffffffba8);
    emitter_json_kv((emitter_t *)arena_ind_str._0_8_,
                    (char *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                    (emitter_type_t)((ulong)in_stack_fffffffffffffbb0 >> 0x20),
                    in_stack_fffffffffffffba8);
    emitter_json_kv((emitter_t *)arena_ind_str._0_8_,
                    (char *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                    (emitter_type_t)((ulong)in_stack_fffffffffffffbb0 >> 0x20),
                    in_stack_fffffffffffffba8);
    emitter_json_object_end((emitter_t *)0x256d479);
    emitter_table_printf
              (emitter,"Background threads: %zu, num_runs: %lu, run_interval: %lu ns\n",
               zero_reallocs,background_thread_run_interval,sz);
    if (mutex) {
      emitter_row_init((emitter_row_t *)&name.link.qre_prev);
      mutex_stats_init_cols
                ((emitter_row_t *)CONCAT44(ninitialized,arena_ind_str._16_4_),
                 (char *)CONCAT44(arena_ind_str._12_4_,arena_ind_str._8_4_),
                 (emitter_col_t *)arena_ind_str._0_8_,
                 (emitter_col_t *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                 in_stack_fffffffffffffbb0);
      emitter_table_row((emitter_t *)arena_ind_str._0_8_,
                        (emitter_row_t *)
                        CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8));
      emitter_json_object_kv_begin((emitter_t *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8)
      ;
      col_uint64_t = (emitter_col_t *)0x8;
      iVar2 = duckdb_je_mallctlnametomib
                        ((char *)arena_ind_str._0_8_,
                         (size_t *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                         (size_t *)in_stack_fffffffffffffbb0);
      if (iVar2 != 0) {
        duckdb_je_malloc_printf
                  ("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n","stats.arenas.0.uptime"
                  );
        abort();
      }
      iVar2 = duckdb_je_mallctlbymib
                        ((size_t *)__vla_expr0,_i_1,
                         (void *)CONCAT44(ninitialized,arena_ind_str._16_4_),
                         (size_t *)CONCAT44(arena_ind_str._12_4_,arena_ind_str._8_4_),
                         (void *)arena_ind_str._0_8_,
                         CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8));
      if (iVar2 != 0) {
        duckdb_je_malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
        abort();
      }
      if (*(char *)(*in_FS_OFFSET + -0x2758) != '\0') {
        duckdb_je_tsd_fetch_slow((tsd_t *)arena_ind_str._0_8_,(_Bool)in_stack_fffffffffffffbbf);
      }
      iVar2 = duckdb_je_ctl_mibnametomib
                        ((tsd_t *)CONCAT44(ninitialized,arena_ind_str._16_4_),
                         (size_t *)CONCAT44(arena_ind_str._12_4_,arena_ind_str._8_4_),
                         arena_ind_str._0_8_,
                         (char *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                         (size_t *)in_stack_fffffffffffffbb0);
      if (iVar2 != 0) {
        duckdb_je_malloc_write("<jemalloc>: Failure in ctl_mibnametomib()\n");
        abort();
      }
      for (sz_15._4_4_ = 0; sz_15._4_4_ < 9; sz_15._4_4_ = sz_15._4_4_ + 1) {
        local_470 = 0x256d6d5;
        mutex_stats_read_global
                  ((size_t *)0x0,mib[0],(char *)miblen,(emitter_col_t *)0x7,col_uint64_t,
                   (emitter_col_t *)stats_mutexes_mib[6],col64[6]._0_8_);
        emitter_json_object_kv_begin
                  ((emitter_t *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
        mutex_stats_emit((emitter_t *)CONCAT44(ninitialized,arena_ind_str._16_4_),
                         (emitter_row_t *)CONCAT44(arena_ind_str._12_4_,arena_ind_str._8_4_),
                         (emitter_col_t *)arena_ind_str._0_8_,
                         (emitter_col_t *)
                         CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8));
        emitter_json_object_end((emitter_t *)0x256d71b);
      }
      emitter_json_object_end((emitter_t *)0x256d738);
    }
    emitter_json_object_end((emitter_t *)0x256d741);
    if (((merged) || (destroyed)) || (unmerged)) {
      emitter_json_object_kv_begin((emitter_t *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8)
      ;
      mib_1[2] = 4;
      iVar2 = duckdb_je_mallctl((char *)CONCAT44(ninitialized,arena_ind_str._16_4_),
                                (void *)CONCAT44(arena_ind_str._12_4_,arena_ind_str._8_4_),
                                (size_t *)arena_ind_str._0_8_,
                                (void *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8
                                                ),(size_t)in_stack_fffffffffffffbb0);
      if (iVar2 != 0) {
        duckdb_je_malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n","arenas.narenas");
        abort();
      }
      sz_14 = 3;
      __vla_expr0 = (unsigned_long)&stack0xfffffffffffffba8;
      lVar1 = -((ulong)(uint)sz_15 + 0xf & 0xfffffffffffffff0);
      pcVar3 = arena_ind_str + lVar1 + -0x18;
      _i_1 = (ulong)(uint)sz_15;
      pcVar5 = arena_ind_str + lVar1 + -0x20;
      pcVar25 = pcVar3;
      pcVar5[0] = '\x0e';
      pcVar5[1] = -0x28;
      pcVar5[2] = 'V';
      pcVar5[3] = '\x02';
      pcVar5[4] = '\0';
      pcVar5[5] = '\0';
      pcVar5[6] = '\0';
      pcVar5[7] = '\0';
      iVar2 = duckdb_je_mallctlnametomib
                        (*(char **)(arena_ind_str + lVar1),
                         *(size_t **)(&stack0xfffffffffffffbb8 + lVar1),
                         *(size_t **)(arena_ind_str + lVar1 + -0x10));
      if (iVar2 != 0) {
        pcVar6 = arena_ind_str + lVar1 + -0x20;
        pcVar6[0] = '(';
        pcVar6[1] = -0x28;
        pcVar6[2] = 'V';
        pcVar6[3] = '\x02';
        pcVar6[4] = '\0';
        pcVar6[5] = '\0';
        pcVar6[6] = '\0';
        pcVar6[7] = '\0';
        duckdb_je_malloc_printf
                  ("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n","arena.0.initialized");
        pcVar7 = arena_ind_str + lVar1 + -0x20;
        pcVar7[0] = '-';
        pcVar7[1] = -0x28;
        pcVar7[2] = 'V';
        pcVar7[3] = '\x02';
        pcVar7[4] = '\0';
        pcVar7[5] = '\0';
        pcVar7[6] = '\0';
        pcVar7[7] = '\0';
        abort();
      }
      arena_ind_str[0xc] = '\0';
      arena_ind_str[0xd] = '\0';
      arena_ind_str[0xe] = '\0';
      arena_ind_str[0xf] = '\0';
      arena_ind_str[0x10] = '\0';
      arena_ind_str[0x11] = '\0';
      arena_ind_str[0x12] = '\0';
      arena_ind_str[0x13] = '\0';
      for (; (uint)arena_ind_str._16_4_ < (uint)sz_15;
          arena_ind_str._16_4_ = arena_ind_str._16_4_ + 1) {
        mib_1[0] = (ulong)(uint)arena_ind_str._16_4_;
        local_418 = 1;
        pcVar8 = arena_ind_str + lVar1 + -0x20;
        pcVar8[0] = -0x5f;
        pcVar8[1] = -0x28;
        pcVar8[2] = 'V';
        pcVar8[3] = '\x02';
        pcVar8[4] = '\0';
        pcVar8[5] = '\0';
        pcVar8[6] = '\0';
        pcVar8[7] = '\0';
        iVar2 = duckdb_je_mallctlbymib
                          (*(size_t **)((long)&__vla_expr0 + lVar1),*(size_t *)((long)&i_1 + lVar1),
                           *(void **)(arena_ind_str + lVar1 + 0x10),
                           *(size_t **)(arena_ind_str + lVar1 + 8),*(void **)(arena_ind_str + lVar1)
                           ,*(size_t *)(&stack0xfffffffffffffbb8 + lVar1));
        if (iVar2 != 0) {
          pcVar9 = arena_ind_str + lVar1 + -0x20;
          pcVar9[0] = -0x4e;
          pcVar9[1] = -0x28;
          pcVar9[2] = 'V';
          pcVar9[3] = '\x02';
          pcVar9[4] = '\0';
          pcVar9[5] = '\0';
          pcVar9[6] = '\0';
          pcVar9[7] = '\0';
          duckdb_je_malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
          pcVar10 = arena_ind_str + lVar1 + -0x20;
          pcVar10[0] = -0x49;
          pcVar10[1] = -0x28;
          pcVar10[2] = 'V';
          pcVar10[3] = '\x02';
          pcVar10[4] = '\0';
          pcVar10[5] = '\0';
          pcVar10[6] = '\0';
          pcVar10[7] = '\0';
          abort();
        }
        if ((pcVar25[(uint)arena_ind_str._16_4_] & 1U) != 0) {
          arena_ind_str._12_4_ = arena_ind_str._12_4_ + 1;
        }
      }
      mib_1[0] = 0x1001;
      local_418 = 1;
      pcVar11 = arena_ind_str + lVar1 + -0x20;
      pcVar11[0] = '2';
      pcVar11[1] = -0x27;
      pcVar11[2] = 'V';
      pcVar11[3] = '\x02';
      pcVar11[4] = '\0';
      pcVar11[5] = '\0';
      pcVar11[6] = '\0';
      pcVar11[7] = '\0';
      iVar2 = duckdb_je_mallctlbymib
                        (*(size_t **)((long)&__vla_expr0 + lVar1),*(size_t *)((long)&i_1 + lVar1),
                         *(void **)(arena_ind_str + lVar1 + 0x10),
                         *(size_t **)(arena_ind_str + lVar1 + 8),*(void **)(arena_ind_str + lVar1),
                         *(size_t *)(&stack0xfffffffffffffbb8 + lVar1));
      if (iVar2 != 0) {
        pcVar12 = arena_ind_str + lVar1 + -0x20;
        pcVar12[0] = 'C';
        pcVar12[1] = -0x27;
        pcVar12[2] = 'V';
        pcVar12[3] = '\x02';
        pcVar12[4] = '\0';
        pcVar12[5] = '\0';
        pcVar12[6] = '\0';
        pcVar12[7] = '\0';
        duckdb_je_malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
        pcVar13 = arena_ind_str + lVar1 + -0x20;
        pcVar13[0] = 'H';
        pcVar13[1] = -0x27;
        pcVar13[2] = 'V';
        pcVar13[3] = '\x02';
        pcVar13[4] = '\0';
        pcVar13[5] = '\0';
        pcVar13[6] = '\0';
        pcVar13[7] = '\0';
        abort();
      }
      if ((merged) && ((1 < (uint)arena_ind_str._12_4_ || (!unmerged)))) {
        pcVar14 = arena_ind_str + lVar1 + -0x20;
        pcVar14[0] = 'w';
        pcVar14[1] = -0x27;
        pcVar14[2] = 'V';
        pcVar14[3] = '\x02';
        pcVar14[4] = '\0';
        pcVar14[5] = '\0';
        pcVar14[6] = '\0';
        pcVar14[7] = '\0';
        emitter_table_printf(emitter,"Merged arenas stats:\n");
        pcVar15 = arena_ind_str + lVar1 + -0x20;
        pcVar15[0] = -0x79;
        pcVar15[1] = -0x27;
        pcVar15[2] = 'V';
        pcVar15[3] = '\x02';
        pcVar15[4] = '\0';
        pcVar15[5] = '\0';
        pcVar15[6] = '\0';
        pcVar15[7] = '\0';
        emitter_json_object_kv_begin
                  (*(emitter_t **)(arena_ind_str + lVar1 + -0x10),*(char **)pcVar3);
        *(uint *)((long)local_468 + lVar1) = (uint)hpa;
        *(undefined8 *)((long)local_468 + lVar1 + -8) = 0x256d9ce;
        stats_arena_print(*(emitter_t **)(&stack0x00000c70 + lVar1),
                          *(uint *)(&stack0x00000c6c + lVar1),(_Bool)(&stack0x00000c6b)[lVar1],
                          (_Bool)(&stack0x00000c6a)[lVar1],(_Bool)(&stack0x00000c69)[lVar1],
                          (_Bool)(&stack0x00000c68)[lVar1],(_Bool)(&stack0x00000c67)[lVar1]);
        pcVar16 = arena_ind_str + lVar1 + -0x20;
        pcVar16[0] = -0x25;
        pcVar16[1] = -0x27;
        pcVar16[2] = 'V';
        pcVar16[3] = '\x02';
        pcVar16[4] = '\0';
        pcVar16[5] = '\0';
        pcVar16[6] = '\0';
        pcVar16[7] = '\0';
        emitter_json_object_end(*(emitter_t **)(arena_ind_str + lVar1 + -0x20));
      }
      if (((ninitialized & 0x1000000) != 0) && (destroyed)) {
        pcVar17 = arena_ind_str + lVar1 + -0x20;
        pcVar17[0] = -4;
        pcVar17[1] = -0x27;
        pcVar17[2] = 'V';
        pcVar17[3] = '\x02';
        pcVar17[4] = '\0';
        pcVar17[5] = '\0';
        pcVar17[6] = '\0';
        pcVar17[7] = '\0';
        emitter_table_printf(emitter,"Destroyed arenas stats:\n");
        pcVar18 = arena_ind_str + lVar1 + -0x20;
        pcVar18[0] = '\f';
        pcVar18[1] = -0x26;
        pcVar18[2] = 'V';
        pcVar18[3] = '\x02';
        pcVar18[4] = '\0';
        pcVar18[5] = '\0';
        pcVar18[6] = '\0';
        pcVar18[7] = '\0';
        emitter_json_object_kv_begin
                  (*(emitter_t **)(arena_ind_str + lVar1 + -0x10),*(char **)pcVar3);
        *(uint *)((long)local_468 + lVar1) = (uint)hpa;
        *(undefined8 *)((long)local_468 + lVar1 + -8) = 0x256da53;
        stats_arena_print(*(emitter_t **)(&stack0x00000c70 + lVar1),
                          *(uint *)(&stack0x00000c6c + lVar1),(_Bool)(&stack0x00000c6b)[lVar1],
                          (_Bool)(&stack0x00000c6a)[lVar1],(_Bool)(&stack0x00000c69)[lVar1],
                          (_Bool)(&stack0x00000c68)[lVar1],(_Bool)(&stack0x00000c67)[lVar1]);
        pcVar19 = arena_ind_str + lVar1 + -0x20;
        pcVar19[0] = '`';
        pcVar19[1] = -0x26;
        pcVar19[2] = 'V';
        pcVar19[3] = '\x02';
        pcVar19[4] = '\0';
        pcVar19[5] = '\0';
        pcVar19[6] = '\0';
        pcVar19[7] = '\0';
        emitter_json_object_end(*(emitter_t **)(arena_ind_str + lVar1 + -0x20));
      }
      if (unmerged) {
        arena_ind_str[0x10] = '\0';
        arena_ind_str[0x11] = '\0';
        arena_ind_str[0x12] = '\0';
        arena_ind_str[0x13] = '\0';
        for (; (uint)arena_ind_str._16_4_ < (uint)sz_15;
            arena_ind_str._16_4_ = arena_ind_str._16_4_ + 1) {
          if ((pcVar25[(uint)arena_ind_str._16_4_] & 1U) != 0) {
            uVar4 = (ulong)(uint)arena_ind_str._16_4_;
            pcVar20 = arena_ind_str + lVar1 + -0x20;
            pcVar20[0] = -0x43;
            pcVar20[1] = -0x26;
            pcVar20[2] = 'V';
            pcVar20[3] = '\x02';
            pcVar20[4] = '\0';
            pcVar20[5] = '\0';
            pcVar20[6] = '\0';
            pcVar20[7] = '\0';
            duckdb_je_malloc_snprintf(&stack0xfffffffffffffbb8,0x14,"%u",uVar4);
            pcVar21 = arena_ind_str + lVar1 + -0x20;
            pcVar21[0] = -0x33;
            pcVar21[1] = -0x26;
            pcVar21[2] = 'V';
            pcVar21[3] = '\x02';
            pcVar21[4] = '\0';
            pcVar21[5] = '\0';
            pcVar21[6] = '\0';
            pcVar21[7] = '\0';
            emitter_json_object_kv_begin
                      (*(emitter_t **)(arena_ind_str + lVar1 + -0x10),*(char **)pcVar3);
            pcVar22 = arena_ind_str + lVar1 + -0x20;
            pcVar22[0] = -0x1a;
            pcVar22[1] = -0x26;
            pcVar22[2] = 'V';
            pcVar22[3] = '\x02';
            pcVar22[4] = '\0';
            pcVar22[5] = '\0';
            pcVar22[6] = '\0';
            pcVar22[7] = '\0';
            emitter_table_printf(emitter,"arenas[%s]:\n",&stack0xfffffffffffffbb8);
            *(uint *)((long)local_468 + lVar1) = (uint)hpa;
            *(undefined8 *)((long)local_468 + lVar1 + -8) = 0x256db2e;
            stats_arena_print(*(emitter_t **)(&stack0x00000c70 + lVar1),
                              *(uint *)(&stack0x00000c6c + lVar1),(_Bool)(&stack0x00000c6b)[lVar1],
                              (_Bool)(&stack0x00000c6a)[lVar1],(_Bool)(&stack0x00000c69)[lVar1],
                              (_Bool)(&stack0x00000c68)[lVar1],(_Bool)(&stack0x00000c67)[lVar1]);
            pcVar23 = arena_ind_str + lVar1 + -0x20;
            pcVar23[0] = ';';
            pcVar23[1] = -0x25;
            pcVar23[2] = 'V';
            pcVar23[3] = '\x02';
            pcVar23[4] = '\0';
            pcVar23[5] = '\0';
            pcVar23[6] = '\0';
            pcVar23[7] = '\0';
            emitter_json_object_end(*(emitter_t **)(arena_ind_str + lVar1 + -0x20));
          }
        }
      }
      pcVar24 = arena_ind_str + lVar1 + -0x20;
      pcVar24[0] = '\\';
      pcVar24[1] = -0x25;
      pcVar24[2] = 'V';
      pcVar24[3] = '\x02';
      pcVar24[4] = '\0';
      pcVar24[5] = '\0';
      pcVar24[6] = '\0';
      pcVar24[7] = '\0';
      emitter_json_object_end(*(emitter_t **)(arena_ind_str + lVar1 + -0x20));
    }
    return;
  }
  duckdb_je_malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n","stats.mapped");
  abort();
}

Assistant:

JEMALLOC_COLD
static void
stats_print_helper(emitter_t *emitter, bool merged, bool destroyed,
    bool unmerged, bool bins, bool large, bool mutex, bool extents, bool hpa) {
	/*
	 * These should be deleted.  We keep them around for a while, to aid in
	 * the transition to the emitter code.
	 */
	size_t allocated, active, metadata, metadata_edata, metadata_rtree,
	    metadata_thp, resident, mapped, retained;
	size_t num_background_threads;
	size_t zero_reallocs;
	uint64_t background_thread_num_runs, background_thread_run_interval;

	CTL_GET("stats.allocated", &allocated, size_t);
	CTL_GET("stats.active", &active, size_t);
	CTL_GET("stats.metadata", &metadata, size_t);
	CTL_GET("stats.metadata_edata", &metadata_edata, size_t);
	CTL_GET("stats.metadata_rtree", &metadata_rtree, size_t);
	CTL_GET("stats.metadata_thp", &metadata_thp, size_t);
	CTL_GET("stats.resident", &resident, size_t);
	CTL_GET("stats.mapped", &mapped, size_t);
	CTL_GET("stats.retained", &retained, size_t);

	CTL_GET("stats.zero_reallocs", &zero_reallocs, size_t);

	if (have_background_thread) {
		CTL_GET("stats.background_thread.num_threads",
		    &num_background_threads, size_t);
		CTL_GET("stats.background_thread.num_runs",
		    &background_thread_num_runs, uint64_t);
		CTL_GET("stats.background_thread.run_interval",
		    &background_thread_run_interval, uint64_t);
	} else {
		num_background_threads = 0;
		background_thread_num_runs = 0;
		background_thread_run_interval = 0;
	}

	/* Generic global stats. */
	emitter_json_object_kv_begin(emitter, "stats");
	emitter_json_kv(emitter, "allocated", emitter_type_size, &allocated);
	emitter_json_kv(emitter, "active", emitter_type_size, &active);
	emitter_json_kv(emitter, "metadata", emitter_type_size, &metadata);
	emitter_json_kv(emitter, "metadata_edata", emitter_type_size,
	    &metadata_edata);
	emitter_json_kv(emitter, "metadata_rtree", emitter_type_size,
	    &metadata_rtree);
	emitter_json_kv(emitter, "metadata_thp", emitter_type_size,
	    &metadata_thp);
	emitter_json_kv(emitter, "resident", emitter_type_size, &resident);
	emitter_json_kv(emitter, "mapped", emitter_type_size, &mapped);
	emitter_json_kv(emitter, "retained", emitter_type_size, &retained);
	emitter_json_kv(emitter, "zero_reallocs", emitter_type_size,
	    &zero_reallocs);

	emitter_table_printf(emitter, "Allocated: %zu, active: %zu, "
	    "metadata: %zu (n_thp %zu, edata %zu, rtree %zu), resident: %zu, "
	    "mapped: %zu, retained: %zu\n", allocated, active, metadata,
		metadata_thp, metadata_edata, metadata_rtree, resident, mapped,
	    retained);

	/* Strange behaviors */
	emitter_table_printf(emitter,
	    "Count of realloc(non-null-ptr, 0) calls: %zu\n", zero_reallocs);

	/* Background thread stats. */
	emitter_json_object_kv_begin(emitter, "background_thread");
	emitter_json_kv(emitter, "num_threads", emitter_type_size,
	    &num_background_threads);
	emitter_json_kv(emitter, "num_runs", emitter_type_uint64,
	    &background_thread_num_runs);
	emitter_json_kv(emitter, "run_interval", emitter_type_uint64,
	    &background_thread_run_interval);
	emitter_json_object_end(emitter); /* Close "background_thread". */

	emitter_table_printf(emitter, "Background threads: %zu, "
	    "num_runs: %"FMTu64", run_interval: %"FMTu64" ns\n",
	    num_background_threads, background_thread_num_runs,
	    background_thread_run_interval);

	if (mutex) {
		emitter_row_t row;
		emitter_col_t name;
		emitter_col_t col64[mutex_prof_num_uint64_t_counters];
		emitter_col_t col32[mutex_prof_num_uint32_t_counters];
		uint64_t uptime;

		emitter_row_init(&row);
		mutex_stats_init_cols(&row, "", &name, col64, col32);

		emitter_table_row(emitter, &row);
		emitter_json_object_kv_begin(emitter, "mutexes");

		CTL_M2_GET("stats.arenas.0.uptime", 0, &uptime, uint64_t);

		size_t stats_mutexes_mib[CTL_MAX_DEPTH];
		CTL_LEAF_PREPARE(stats_mutexes_mib, 0, "stats.mutexes");
		for (int i = 0; i < mutex_prof_num_global_mutexes; i++) {
			mutex_stats_read_global(stats_mutexes_mib, 2,
			    global_mutex_names[i], &name, col64, col32, uptime);
			emitter_json_object_kv_begin(emitter, global_mutex_names[i]);
			mutex_stats_emit(emitter, &row, col64, col32);
			emitter_json_object_end(emitter);
		}

		emitter_json_object_end(emitter); /* Close "mutexes". */
	}

	emitter_json_object_end(emitter); /* Close "stats". */

	if (merged || destroyed || unmerged) {
		unsigned narenas;

		emitter_json_object_kv_begin(emitter, "stats.arenas");

		CTL_GET("arenas.narenas", &narenas, unsigned);
		size_t mib[3];
		size_t miblen = sizeof(mib) / sizeof(size_t);
		size_t sz;
		VARIABLE_ARRAY_UNSAFE(bool, initialized, narenas);
		bool destroyed_initialized;
		unsigned i, ninitialized;

		xmallctlnametomib("arena.0.initialized", mib, &miblen);
		for (i = ninitialized = 0; i < narenas; i++) {
			mib[1] = i;
			sz = sizeof(bool);
			xmallctlbymib(mib, miblen, &initialized[i], &sz,
			    NULL, 0);
			if (initialized[i]) {
				ninitialized++;
			}
		}
		mib[1] = MALLCTL_ARENAS_DESTROYED;
		sz = sizeof(bool);
		xmallctlbymib(mib, miblen, &destroyed_initialized, &sz,
		    NULL, 0);

		/* Merged stats. */
		if (merged && (ninitialized > 1 || !unmerged)) {
			/* Print merged arena stats. */
			emitter_table_printf(emitter, "Merged arenas stats:\n");
			emitter_json_object_kv_begin(emitter, "merged");
			stats_arena_print(emitter, MALLCTL_ARENAS_ALL, bins,
			    large, mutex, extents, hpa);
			emitter_json_object_end(emitter); /* Close "merged". */
		}

		/* Destroyed stats. */
		if (destroyed_initialized && destroyed) {
			/* Print destroyed arena stats. */
			emitter_table_printf(emitter,
			    "Destroyed arenas stats:\n");
			emitter_json_object_kv_begin(emitter, "destroyed");
			stats_arena_print(emitter, MALLCTL_ARENAS_DESTROYED,
			    bins, large, mutex, extents, hpa);
			emitter_json_object_end(emitter); /* Close "destroyed". */
		}

		/* Unmerged stats. */
		if (unmerged) {
			for (i = 0; i < narenas; i++) {
				if (initialized[i]) {
					char arena_ind_str[20];
					malloc_snprintf(arena_ind_str,
					    sizeof(arena_ind_str), "%u", i);
					emitter_json_object_kv_begin(emitter,
					    arena_ind_str);
					emitter_table_printf(emitter,
					    "arenas[%s]:\n", arena_ind_str);
					stats_arena_print(emitter, i, bins,
					    large, mutex, extents, hpa);
					/* Close "<arena-ind>". */
					emitter_json_object_end(emitter);
				}
			}
		}
		emitter_json_object_end(emitter); /* Close "stats.arenas". */
	}
}